

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerResults.cpp
# Opt level: O0

bool __thiscall LINAnalyzerResults::IsFrameChecksum(LINAnalyzerResults *this,U64 frame_index)

{
  U64 local_38;
  U64 last_frame;
  U64 first_frame;
  U64 packet_id;
  U64 frame_index_local;
  LINAnalyzerResults *this_local;
  
  packet_id = frame_index;
  frame_index_local = (U64)this;
  first_frame = AnalyzerResults::GetPacketContainingFrame((ulonglong)this);
  if (((ulonglong *)first_frame == (ulonglong *)0xffffffffffffffff) ||
     (AnalyzerResults::GetFramesContainedInPacket
                ((ulonglong)this,(ulonglong *)first_frame,&last_frame), local_38 != packet_id)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool LINAnalyzerResults::IsFrameChecksum( U64 frame_index )
{
    U64 packet_id = GetPacketContainingFrame( frame_index );
    if( packet_id != INVALID_RESULT_INDEX )
    {
        U64 first_frame;
        U64 last_frame;

        GetFramesContainedInPacket( packet_id, &first_frame, &last_frame );

        if( last_frame == frame_index )
            return true;
    }

    return false;
}